

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O3

const_iterator
cmRemoveDuplicates<std::vector<cmTarget*,std::allocator<cmTarget*>>>
          (vector<cmTarget_*,_std::allocator<cmTarget_*>_> *r)

{
  cmTarget *pcVar1;
  const_iterator __position;
  const_iterator cVar2;
  const_iterator cVar3;
  ulong uVar4;
  ulong uVar5;
  cmTarget **ppcVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  size_t count;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> unique;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  unsigned_long local_60;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> local_58;
  cmTarget *local_38;
  
  local_58.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (cmTarget **)0x0;
  local_58.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (cmTarget **)0x0;
  local_58.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::reserve
            (&local_58,
             (long)(r->super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(r->super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_60 = 0;
  ppcVar6 = (r->super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  cVar3._M_current =
       (r->super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (ppcVar6 != cVar3._M_current) {
    do {
      pcVar1 = *ppcVar6;
      uVar5 = (long)local_58.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      cVar2._M_current =
           local_58.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      while (__position._M_current = cVar2._M_current, 0 < (long)uVar5) {
        uVar4 = uVar5 >> 1;
        uVar5 = ~uVar4 + uVar5;
        cVar2._M_current = __position._M_current + uVar4 + 1;
        if (pcVar1 <= __position._M_current[uVar4]) {
          uVar5 = uVar4;
          cVar2._M_current = __position._M_current;
        }
      }
      if ((__position._M_current ==
           local_58.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
           super__Vector_impl_data._M_finish) || (*__position._M_current != pcVar1)) {
        local_38 = pcVar1;
        std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::_M_insert_rval
                  (&local_58,__position,&local_38);
      }
      else if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish ==
               local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_78,
                   (iterator)
                   local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_60);
      }
      else {
        *local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_60;
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      ppcVar6 = ppcVar6 + 1;
      local_60 = local_60 + 1;
    } while (ppcVar6 != cVar3._M_current);
    if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      cVar3 = cmRemoveIndices<std::vector<cmTarget*,std::allocator<cmTarget*>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                        (r,&local_78);
    }
    if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_58.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
      super__Vector_impl_data._M_start != (cmTarget **)0x0) {
    operator_delete(local_58.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (const_iterator)cVar3._M_current;
}

Assistant:

typename Range::const_iterator cmRemoveDuplicates(Range& r)
{
  typedef typename ContainerAlgorithms::RemoveDuplicatesAPI<Range> API;
  typedef typename API::value_type T;
  std::vector<T> unique;
  unique.reserve(r.size());
  std::vector<size_t> indices;
  size_t count = 0;
  const typename Range::const_iterator end = r.end();
  for(typename Range::const_iterator it = r.begin();
      it != end; ++it, ++count)
    {
    const typename std::vector<T>::iterator low =
        std::lower_bound(unique.begin(), unique.end(),
                         API::uniqueValue(it), API::lessThan);
    if (low == unique.end() || API::valueCompare(low, it))
      {
      unique.insert(low, API::uniqueValue(it));
      }
    else
      {
      indices.push_back(count);
      }
    }
  if (indices.empty())
    {
    return end;
    }
  return cmRemoveIndices(r, indices);
}